

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O3

Vec_Int_t * Gia_ManGetCex(Gia_Man_t *pGia,Vec_Int_t *vId2Lit,sat_solver *pSat,Vec_Int_t *vCex)

{
  int iVar1;
  uint uVar2;
  uint Entry;
  Vec_Int_t *pVVar3;
  ulong uVar4;
  long lVar5;
  
  vCex->nSize = 0;
  pVVar3 = pGia->vCis;
  uVar4 = (ulong)(uint)pVVar3->nSize;
  if (pGia->nRegs < pVVar3->nSize) {
    lVar5 = 0;
    do {
      if ((int)uVar4 <= lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pVVar3->pArray[lVar5];
      if (((long)iVar1 < 0) || (pGia->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) {
        return vCex;
      }
      Entry = 2;
      if ((iVar1 < vId2Lit->nSize) && (uVar2 = vId2Lit->pArray[iVar1], uVar2 != 0)) {
        if ((int)uVar2 < 1) {
          __assert_fail("LitSat > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweeper.c"
                        ,0x303,
                        "Vec_Int_t *Gia_ManGetCex(Gia_Man_t *, Vec_Int_t *, sat_solver *, Vec_Int_t *)"
                       );
        }
        if (pSat->size <= (int)(uVar2 >> 1)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                        ,0xcd,"int sat_solver_var_value(sat_solver *, int)");
        }
        Entry = uVar2 & 1 ^ (uint)(pSat->model[uVar2 >> 1] == 1);
      }
      Vec_IntPush(vCex,Entry);
      lVar5 = lVar5 + 1;
      pVVar3 = pGia->vCis;
      uVar4 = (ulong)pVVar3->nSize;
    } while (lVar5 < (long)(uVar4 - (long)pGia->nRegs));
  }
  return vCex;
}

Assistant:

static Vec_Int_t * Gia_ManGetCex( Gia_Man_t * pGia, Vec_Int_t * vId2Lit, sat_solver * pSat, Vec_Int_t * vCex )
{
    Gia_Obj_t * pObj;
    int i, LitSat, Value;
    Vec_IntClear( vCex );
    Gia_ManForEachPi( pGia, pObj, i )
    {
        if ( Gia_ObjId(pGia, pObj) >= Vec_IntSize(vId2Lit) )
        {
            Vec_IntPush( vCex, 2 );
            continue;
        }
        LitSat = Vec_IntEntry( vId2Lit, Gia_ObjId(pGia, pObj) );
        if ( LitSat == 0 )
        {
            Vec_IntPush( vCex, 2 );
            continue;
        }
        assert( LitSat > 0 );
        Value = sat_solver_var_value(pSat, Abc_Lit2Var(LitSat)) ^ Abc_LitIsCompl(LitSat);
        Vec_IntPush( vCex, Value );
    }
    return vCex;
}